

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O0

void Abc_NtkRetimeMinAreaUpdateLatches
               (Abc_Ntk_t *pNtk,Vec_Ptr_t *vMinCut,int fForward,int fUseOldNames)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *p_02;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pNodeTo;
  int local_88;
  int local_84;
  int k;
  int i;
  Abc_Obj_t *pBuffer;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pLatchOut;
  Abc_Obj_t *pLatchIn;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vBuffers;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vBoxesNew;
  Vec_Ptr_t *vBoxes;
  Vec_Ptr_t *vCos;
  Vec_Ptr_t *vCis;
  int fUseOldNames_local;
  int fForward_local;
  Vec_Ptr_t *vMinCut_local;
  Abc_Ntk_t *pNtk_local;
  
  pVVar1 = pNtk->vCis;
  iVar2 = Abc_NtkCiNum(pNtk);
  iVar3 = Abc_NtkLatchNum(pNtk);
  Vec_PtrShrink(pVVar1,iVar2 - iVar3);
  pVVar1 = pNtk->vCos;
  iVar2 = Abc_NtkCoNum(pNtk);
  iVar3 = Abc_NtkLatchNum(pNtk);
  Vec_PtrShrink(pVVar1,iVar2 - iVar3);
  pVVar1 = pNtk->vCis;
  pNtk->vCis = (Vec_Ptr_t *)0x0;
  p = pNtk->vCos;
  pNtk->vCos = (Vec_Ptr_t *)0x0;
  p_00 = pNtk->vBoxes;
  pNtk->vBoxes = (Vec_Ptr_t *)0x0;
  p_01 = Vec_PtrAlloc(100);
  for (local_84 = 0; iVar2 = Vec_PtrSize(p_00), local_84 < iVar2; local_84 = local_84 + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_00,local_84);
    iVar2 = Abc_ObjIsLatch(pAVar4);
    if (iVar2 == 0) {
      Vec_PtrPush(p_01,pAVar4);
    }
  }
  vNodes_00 = Vec_PtrAlloc(100);
  p_02 = Vec_PtrAlloc(100);
  local_84 = 0;
  do {
    iVar2 = Vec_PtrSize(vMinCut);
    if (iVar2 <= local_84) {
      Vec_PtrFree(vNodes_00);
      for (local_84 = 0; iVar2 = Vec_PtrSize(p_02), local_84 < iVar2; local_84 = local_84 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_02,local_84);
        pAVar6 = Abc_ObjFanin0(pAVar4);
        Abc_ObjTransferFanout(pAVar4,pAVar6);
        Abc_NtkDeleteObj(pAVar4);
      }
      Vec_PtrFree(p_02);
      for (local_84 = 0; iVar2 = Vec_PtrSize(p_00), local_84 < iVar2; local_84 = local_84 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_00,local_84);
        iVar2 = Abc_ObjIsLatch(pAVar4);
        if ((iVar2 != 0) && (iVar2 = Abc_NodeIsTravIdCurrent(pAVar4), iVar2 == 0)) {
          pAVar6 = Abc_ObjFanout0(pAVar4);
          pAVar7 = Abc_ObjFanin0(pAVar4);
          iVar2 = Abc_ObjFanoutNum(pAVar6);
          if (0 < iVar2) {
            pNodeTo = Abc_ObjFanin0(pAVar7);
            Abc_ObjTransferFanout(pAVar6,pNodeTo);
          }
          Abc_NtkDeleteObj(pAVar6);
          Abc_NtkDeleteObj(pAVar4);
          Abc_NtkDeleteObj(pAVar7);
        }
      }
      pNtk->vCis = pVVar1;
      pNtk->vCos = p;
      pNtk->vBoxes = p_01;
      Vec_PtrFree(p_00);
      return;
    }
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vMinCut,local_84);
    iVar2 = Abc_ObjIsCi(pAVar4);
    if ((iVar2 == 0) || (fForward == 0)) {
      iVar2 = Abc_ObjIsCo(pAVar4);
      if ((iVar2 == 0) || (fForward != 0)) {
        pNext = Abc_NtkCreateBo(pNtk);
        pLatchIn = Abc_NtkCreateLatch(pNtk);
        pLatchOut = Abc_NtkCreateBi(pNtk);
        if (fUseOldNames == 0) {
          pcVar5 = Abc_ObjName(pAVar4);
          Abc_ObjAssignName(pNext,pcVar5,"_o1");
          pcVar5 = Abc_ObjName(pAVar4);
          Abc_ObjAssignName(pLatchOut,pcVar5,"_i1");
        }
        else {
          pcVar5 = Abc_ObjName(pLatchIn);
          Abc_ObjAssignName(pNext,pcVar5,"_out");
          pcVar5 = Abc_ObjName(pLatchIn);
          Abc_ObjAssignName(pLatchOut,pcVar5,"_in");
        }
        Abc_ObjAddFanin(pNext,pLatchIn);
        Abc_ObjAddFanin(pLatchIn,pLatchOut);
        if (fForward == 0) {
          Abc_NodeCollectFanouts(pAVar4,vNodes_00);
          for (local_88 = 0; iVar2 = Vec_PtrSize(vNodes_00), local_88 < iVar2;
              local_88 = local_88 + 1) {
            pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_88);
            if ((*(uint *)&pAVar6->field_0x14 >> 4 & 1) != 0) {
              Abc_ObjPatchFanin(pAVar6,pAVar4,pNext);
            }
          }
        }
        else {
          iVar2 = 1;
          if ((pAVar4->field_6).pTemp != (void *)0x0) {
            iVar2 = 2;
          }
          pLatchIn->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)iVar2;
          Abc_NodeCollectFanouts(pAVar4,vNodes_00);
          for (local_88 = 0; iVar2 = Vec_PtrSize(vNodes_00), local_88 < iVar2;
              local_88 = local_88 + 1) {
            pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_88);
            if ((*(uint *)&pAVar6->field_0x14 >> 4 & 1) == 0) {
              Abc_ObjPatchFanin(pAVar6,pAVar4,pNext);
            }
          }
        }
        Abc_ObjAddFanin(pLatchOut,pAVar4);
      }
      else {
        pLatchIn = Abc_ObjFanout0(pAVar4);
        pNext = Abc_ObjFanout0(pLatchIn);
        iVar2 = Abc_ObjIsBo(pNext);
        if (((iVar2 == 0) || (iVar2 = Abc_ObjIsLatch(pLatchIn), iVar2 == 0)) ||
           (iVar2 = Abc_ObjIsBi(pAVar4), iVar2 == 0)) {
          __assert_fail("Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                        ,0x1d4,
                        "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int, int)"
                       );
        }
        Abc_NodeSetTravIdCurrent(pLatchIn);
        pAVar6 = Abc_ObjFanin0(pAVar4);
        pLatchOut = pAVar4;
        if ((*(uint *)&pAVar6->field_0x14 >> 4 & 1) != 0) {
          __assert_fail("!Abc_ObjFanin0(pLatchIn)->fMarkA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                        ,0x1d7,
                        "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int, int)"
                       );
        }
      }
    }
    else {
      pLatchIn = Abc_ObjFanin0(pAVar4);
      pLatchOut = Abc_ObjFanin0(pLatchIn);
      iVar2 = Abc_ObjIsBo(pAVar4);
      if (((iVar2 == 0) || (iVar2 = Abc_ObjIsLatch(pLatchIn), iVar2 == 0)) ||
         (iVar2 = Abc_ObjIsBi(pLatchOut), iVar2 == 0)) {
        __assert_fail("Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                      ,0x1b5,
                      "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int, int)");
      }
      Abc_NodeSetTravIdCurrent(pLatchIn);
      local_88 = 0;
      while ((iVar2 = Abc_ObjFanoutNum(pAVar4), local_88 < iVar2 &&
             (pAVar6 = Abc_ObjFanout(pAVar4,local_88), (*(uint *)&pAVar6->field_0x14 >> 4 & 1) == 0)
             )) {
        local_88 = local_88 + 1;
      }
      iVar2 = Abc_ObjFanoutNum(pAVar4);
      if (local_88 < iVar2) {
        pAVar6 = Abc_ObjFanin0(pLatchOut);
        pAVar6 = Abc_NtkCreateNodeBuf(pNtk,pAVar6);
        pcVar5 = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar6,pcVar5,"_buf");
        pAVar7 = Abc_ObjFanin0(pLatchOut);
        Abc_ObjPatchFanin(pLatchOut,pAVar7,pAVar6);
        Vec_PtrPush(p_02,pAVar6);
        Abc_NodeCollectFanouts(pAVar4,vNodes_00);
        for (local_88 = 0; iVar2 = Vec_PtrSize(vNodes_00), local_88 < iVar2; local_88 = local_88 + 1
            ) {
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_88);
          if ((*(uint *)&pAVar7->field_0x14 >> 4 & 1) != 0) {
            Abc_ObjPatchFanin(pAVar7,pAVar4,pAVar6);
          }
        }
      }
      iVar2 = Abc_ObjFanoutNum(pAVar4);
      pNext = pAVar4;
      if (iVar2 < 1) {
        __assert_fail("Abc_ObjFanoutNum(pObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                      ,0x1cb,
                      "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int, int)");
      }
    }
    Vec_PtrPush(pVVar1,pNext);
    Vec_PtrPush(p_01,pLatchIn);
    Vec_PtrPush(p,pLatchOut);
    local_84 = local_84 + 1;
  } while( true );
}

Assistant:

void Abc_NtkRetimeMinAreaUpdateLatches( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMinCut, int fForward, int fUseOldNames )
{
    Vec_Ptr_t * vCis, * vCos, * vBoxes, * vBoxesNew, * vNodes, * vBuffers;
    Abc_Obj_t * pObj, * pLatch, * pLatchIn, * pLatchOut, * pNext, * pBuffer;
    int i, k;
    // create new latches
    Vec_PtrShrink( pNtk->vCis, Abc_NtkCiNum(pNtk) - Abc_NtkLatchNum(pNtk) );
    Vec_PtrShrink( pNtk->vCos, Abc_NtkCoNum(pNtk) - Abc_NtkLatchNum(pNtk) );
    vCis   = pNtk->vCis;   pNtk->vCis   = NULL;  
    vCos   = pNtk->vCos;   pNtk->vCos   = NULL;  
    vBoxes = pNtk->vBoxes; pNtk->vBoxes = NULL; 
    // transfer boxes
    vBoxesNew = Vec_PtrAlloc(100);
    Vec_PtrForEachEntry( Abc_Obj_t *, vBoxes, pObj, i )
        if ( !Abc_ObjIsLatch(pObj) )
            Vec_PtrPush( vBoxesNew, pObj );
    // create or reuse latches
    vNodes = Vec_PtrAlloc( 100 );
    vBuffers = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vMinCut, pObj, i )
    {
        if ( Abc_ObjIsCi(pObj) && fForward )
        {
            pLatchOut = pObj;
            pLatch    = Abc_ObjFanin0(pLatchOut);
            pLatchIn  = Abc_ObjFanin0(pLatch);
            assert( Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn) );
            // mark the latch as reused
            Abc_NodeSetTravIdCurrent( pLatch );

            // check if there are marked fanouts
            // (these are fanouts to be connected to the latch input)
            Abc_ObjForEachFanout( pObj, pNext, k )
                if ( pNext->fMarkA )
                    break;
            if ( k < Abc_ObjFanoutNum(pObj) )
            {
                // add the buffer
                pBuffer = Abc_NtkCreateNodeBuf( pNtk, Abc_ObjFanin0(pLatchIn) );
                Abc_ObjAssignName( pBuffer, Abc_ObjName(pObj), "_buf" );
                Abc_ObjPatchFanin( pLatchIn, Abc_ObjFanin0(pLatchIn), pBuffer );
                Vec_PtrPush( vBuffers, pBuffer );
                // redirect edges to the unvisited fanouts of the node
                Abc_NodeCollectFanouts( pObj, vNodes );
                Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, k )
                    if ( pNext->fMarkA )
                        Abc_ObjPatchFanin( pNext, pObj, pBuffer );
            }
            assert( Abc_ObjFanoutNum(pObj) > 0 );
//            if ( Abc_ObjFanoutNum(pObj) == 0 )
//                Abc_NtkDeleteObj_rec( pObj, 0 );
        }
        else if ( Abc_ObjIsCo(pObj) && !fForward )
        {
            pLatchIn  = pObj;
            pLatch    = Abc_ObjFanout0(pLatchIn);
            pLatchOut = Abc_ObjFanout0(pLatch);
            assert( Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn) );
            // mark the latch as reused
            Abc_NodeSetTravIdCurrent( pLatch );
            assert( !Abc_ObjFanin0(pLatchIn)->fMarkA );
        }
        else
        {
            pLatchOut = Abc_NtkCreateBo(pNtk);
            pLatch    = Abc_NtkCreateLatch(pNtk);
            pLatchIn  = Abc_NtkCreateBi(pNtk);

            if ( fUseOldNames )
            {
                Abc_ObjAssignName( pLatchOut, Abc_ObjName(pLatch), "_out" );
                Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pLatch), "_in" );
            }
            else
            {
                Abc_ObjAssignName( pLatchOut, Abc_ObjName(pObj), "_o1" );
                Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pObj), "_i1" );
            }
            // connect
            Abc_ObjAddFanin( pLatchOut, pLatch );
            Abc_ObjAddFanin( pLatch, pLatchIn );
            if ( fForward )
            {
                pLatch->pData = (void *)(ABC_PTRUINT_T)(pObj->pCopy? ABC_INIT_ONE : ABC_INIT_ZERO);
                // redirect edges to the unvisited fanouts of the node
                Abc_NodeCollectFanouts( pObj, vNodes );
                Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, k )
                    if ( !pNext->fMarkA )
                        Abc_ObjPatchFanin( pNext, pObj, pLatchOut );
            }
            else
            {
                // redirect edges to the visited fanouts of the node
                Abc_NodeCollectFanouts( pObj, vNodes );
                Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, k )
                    if ( pNext->fMarkA )
                        Abc_ObjPatchFanin( pNext, pObj, pLatchOut );
            }
            // connect latch to the node
            Abc_ObjAddFanin( pLatchIn, pObj );
        }
        Vec_PtrPush( vCis, pLatchOut );
        Vec_PtrPush( vBoxesNew, pLatch );
        Vec_PtrPush( vCos, pLatchIn );
    }
    Vec_PtrFree( vNodes );
    // remove buffers
    Vec_PtrForEachEntry( Abc_Obj_t *, vBuffers, pObj, i )
    {
        Abc_ObjTransferFanout( pObj, Abc_ObjFanin0(pObj) );
        Abc_NtkDeleteObj( pObj );
    }
    Vec_PtrFree( vBuffers );
    // remove useless latches
    Vec_PtrForEachEntry( Abc_Obj_t *, vBoxes, pObj, i )
    {
        if ( !Abc_ObjIsLatch(pObj) )
            continue;
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        pLatchOut = Abc_ObjFanout0(pObj);
        pLatch    = pObj;
        pLatchIn  = Abc_ObjFanin0(pObj);
        if ( Abc_ObjFanoutNum(pLatchOut) > 0 )
            Abc_ObjTransferFanout( pLatchOut, Abc_ObjFanin0(pLatchIn) );
        Abc_NtkDeleteObj( pLatchOut );
        Abc_NtkDeleteObj( pObj );
        Abc_NtkDeleteObj( pLatchIn );
    }
    // set the arrays
    pNtk->vCis = vCis;
    pNtk->vCos = vCos;
    pNtk->vBoxes = vBoxesNew;
    Vec_PtrFree( vBoxes );
}